

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++:1305:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:1305:17)>
             *this)

{
  ThreadId *pTVar1;
  ThreadId *this_00;
  bool bVar2;
  DebugExpression<bool> _kjCondition_2;
  ThreadId id3;
  DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> _kjCondition;
  Fault f;
  ThreadId local_508 [5];
  undefined1 local_4e0 [16];
  char *local_4d0;
  undefined1 *puStack_4c8;
  bool local_4c0;
  undefined7 uStack_4bf;
  Fault local_348 [101];
  
  local_508[0] = ThreadId::current();
  ThreadId::assertCurrentThread(local_508);
  local_4e0._0_8_ = (this->f).id1;
  bVar2 = ((ThreadId *)local_4e0._0_8_)->id == local_508[0].id;
  local_4d0 = " != ";
  puStack_4c8 = &DAT_00000005;
  local_4c0 = !bVar2;
  local_4e0._8_8_ = local_508;
  if (bVar2) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ThreadId&,kj::ThreadId&>&>
              (local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x51c,FAILED,"id1 != id3","_kjCondition,",
               (DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> *)local_4e0);
    _::Debug::Fault::fatal(local_348);
  }
  pTVar1 = (this->f).id2;
  local_4c0 = pTVar1->id != local_508[0].id;
  local_4d0 = " != ";
  puStack_4c8 = &DAT_00000005;
  if (local_4c0) {
    this_00 = (ThreadId *)local_4e0._0_8_;
    local_4e0._0_8_ = pTVar1;
    ThreadId::assertCurrentThread(this_00);
    local_4e0._0_8_ = local_4e0._0_8_ & 0xffffffffffffff00;
    local_348[0].exception._0_1_ = 0;
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x51f,ERROR,"\"code did not throw: \" \"id1.assertCurrentThread()\"",
                 (char (*) [46])"code did not throw: id1.assertCurrentThread()");
    }
    if (local_4e0[0] == '\x01') {
      Exception::~Exception((Exception *)(local_4e0 + 8));
    }
    return;
  }
  local_4e0._0_8_ = pTVar1;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ThreadId&,kj::ThreadId&>&>
            (local_348,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
             ,0x51d,FAILED,"id2 != id3","_kjCondition,",
             (DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> *)local_4e0);
  _::Debug::Fault::fatal(local_348);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }